

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O3

void parseACTFile(filebuf *file)

{
  pointer paVar1;
  long lVar2;
  ulong uVar3;
  uint3 *__s;
  ushort uVar4;
  array<char,_772UL> buf;
  uint3 local_324 [192];
  ushort local_24;
  
  __s = local_324;
  memset(__s,0,0x304);
  lVar2 = (**(code **)(*(long *)file + 0x40))(file,__s,0x304);
  if (lVar2 == 0x300) {
    uVar4 = 0x100;
  }
  else {
    if (lVar2 != 0x304) {
      error("Invalid file size for ACT file (expected 768 or 772 bytes, got %zu",lVar2);
      return;
    }
    uVar4 = local_24 << 8 | local_24 >> 8;
    if ((ushort)(uVar4 - 0x101) < 0xff00) {
      error("Invalid number of colors in ACT file (%u)",(ulong)uVar4);
      return;
    }
  }
  if ((ushort)((ushort)options.nbPalettes * (ushort)options.nbColorsPerPal) < uVar4) {
    warning("ACT file contains %u colors, but there can only be %u; ignoring extra");
    uVar4 = (ushort)options.nbPalettes * (ushort)options.nbColorsPerPal;
  }
  if (options.palSpec.
      super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      options.palSpec.
      super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    options.palSpec.
    super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         options.palSpec.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  if (options.palSpec.
      super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      options.palSpec.
      super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::_M_realloc_insert<>
              (&options.palSpec,
               (iterator)
               options.palSpec.
               super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  }
  else {
    paVar1 = options.palSpec.
             super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    paVar1->_M_elems[0].red = '\0';
    paVar1->_M_elems[0].green = '\0';
    paVar1->_M_elems[0].blue = '\0';
    paVar1->_M_elems[0].alpha = '\0';
    paVar1->_M_elems[1].red = '\0';
    paVar1->_M_elems[1].green = '\0';
    paVar1->_M_elems[1].blue = '\0';
    paVar1->_M_elems[1].alpha = '\0';
    paVar1->_M_elems[2].red = '\0';
    paVar1->_M_elems[2].green = '\0';
    paVar1->_M_elems[2].blue = '\0';
    paVar1->_M_elems[2].alpha = '\0';
    paVar1->_M_elems[3].red = '\0';
    paVar1->_M_elems[3].green = '\0';
    paVar1->_M_elems[3].blue = '\0';
    paVar1->_M_elems[3].alpha = '\0';
    options.palSpec.
    super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         options.palSpec.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  if (uVar4 != 0) {
    uVar3 = 0;
    do {
      options.palSpec.
      super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish[-1]._M_elems[uVar3] = (Rgba)(*__s | 0xff000000);
      uVar3 = uVar3 + 1;
      if (uVar3 == options.nbColorsPerPal) {
        if (options.palSpec.
            super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            options.palSpec.
            super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::
          _M_realloc_insert<>(&options.palSpec,
                              (iterator)
                              options.palSpec.
                              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
        }
        else {
          paVar1 = options.palSpec.
                   super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          paVar1->_M_elems[0].red = '\0';
          paVar1->_M_elems[0].green = '\0';
          paVar1->_M_elems[0].blue = '\0';
          paVar1->_M_elems[0].alpha = '\0';
          paVar1->_M_elems[1].red = '\0';
          paVar1->_M_elems[1].green = '\0';
          paVar1->_M_elems[1].blue = '\0';
          paVar1->_M_elems[1].alpha = '\0';
          paVar1->_M_elems[2].red = '\0';
          paVar1->_M_elems[2].green = '\0';
          paVar1->_M_elems[2].blue = '\0';
          paVar1->_M_elems[2].alpha = '\0';
          paVar1->_M_elems[3].red = '\0';
          paVar1->_M_elems[3].green = '\0';
          paVar1->_M_elems[3].blue = '\0';
          paVar1->_M_elems[3].alpha = '\0';
          options.palSpec.
          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl
          .super__Vector_impl_data._M_finish =
               options.palSpec.
               super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar3 = 0;
      }
      __s = (uint3 *)((long)__s + 3);
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    if (uVar3 != 0) {
      return;
    }
  }
  options.palSpec.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       options.palSpec.
       super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
       super__Vector_impl_data._M_finish + -1;
  return;
}

Assistant:

static void parseACTFile(std::filebuf &file) {
	// https://www.adobe.com/devnet-apps/photoshop/fileformatashtml/#50577411_pgfId-1070626

	std::array<char, 772> buf{};
	auto len = file.sgetn(buf.data(), buf.size());

	uint16_t nbColors = 256;
	if (len == 772) {
		nbColors = readBE<uint16_t>(&buf[768]);
		// TODO: apparently there is a "transparent color index"? What?
		if (nbColors > 256 || nbColors == 0) {
			error("Invalid number of colors in ACT file (%" PRIu16 ")", nbColors);
			return;
		}
	} else if (len != 768) {
		error("Invalid file size for ACT file (expected 768 or 772 bytes, got %zu", len);
		return;
	}

	if (nbColors > options.nbColorsPerPal * options.nbPalettes) {
		warning("ACT file contains %" PRIu16 " colors, but there can only be %" PRIu16
		        "; ignoring extra",
		        nbColors, options.nbColorsPerPal * options.nbPalettes);
		nbColors = options.nbColorsPerPal * options.nbPalettes;
	}

	options.palSpec.clear();
	options.palSpec.emplace_back();

	char const *ptr = buf.data();
	size_t colorIdx = 0;
	for (uint16_t i = 0; i < nbColors; ++i) {
		Rgba &color = options.palSpec.back()[colorIdx];
		color = Rgba(ptr[0], ptr[1], ptr[2], 0xFF);

		ptr += 3;
		++colorIdx;
		if (colorIdx == options.nbColorsPerPal) {
			options.palSpec.emplace_back();
			colorIdx = 0;
		}
	}

	// Remove the spurious empty palette if there is one
	if (colorIdx == 0) {
		options.palSpec.pop_back();
	}
}